

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_35::InMemoryFile::copy(InMemoryFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *pEVar1;
  Clock *pCVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  Impl *in_RCX;
  ulong in_R8;
  ulong uVar5;
  EVP_PKEY_CTX *pEVar6;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> local_60 [3];
  
  (**(code **)(*(long *)src + 0x10))(local_60);
  uVar5 = (long)local_60[0].ptr - (long)in_RCX;
  if (in_RCX <= local_60[0].ptr && uVar5 != 0) {
    if (in_R8 < uVar5) {
      uVar5 = in_R8;
    }
    if (uVar5 != 0) {
      _::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
      local_60[0].ptr = &(this->impl).value;
      local_60[0].mutex = &(this->impl).mutex;
      Impl::ensureCapacity(local_60[0].ptr,(size_t)(dst + uVar5));
      lVar4 = (**(code **)(*(long *)src + 0x30))(src);
      pEVar1 = (EVP_PKEY_CTX *)(this->impl).value.size;
      pEVar6 = dst + lVar4;
      if (dst + lVar4 < pEVar1) {
        pEVar6 = pEVar1;
      }
      pCVar2 = (this->impl).value.clock;
      (this->impl).value.size = (size_t)pEVar6;
      iVar3 = (**pCVar2->_vptr_Clock)();
      (this->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar3);
      Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(local_60);
      goto LAB_00315f5c;
    }
  }
  lVar4 = 0;
LAB_00315f5c:
  return (int)lVar4;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t copySize) const override {
    size_t fromFileSize = from.stat().size;
    if (fromFileSize <= fromOffset) return 0;

    // Clamp size to EOF.
    copySize = kj::min(copySize, fromFileSize - fromOffset);
    if (copySize == 0) return 0;

    auto lock = impl.lockExclusive();

    // Allocate space for the copy.
    uint64_t end = offset + copySize;
    lock->ensureCapacity(end);

    // Read directly into our backing store.
    size_t n = from.read(fromOffset, lock->bytes.slice(offset, end));
    lock->size = kj::max(lock->size, offset + n);

    lock->modified();
    return n;
  }